

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O3

void __thiscall DyndepParserTestVersion1_0::Run(DyndepParserTestVersion1_0 *this)

{
  int iVar1;
  
  iVar1 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse(&this->super_DyndepParserTest,"ninja_dyndep_version = 1.0\n");
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, Version1_0) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1.0\n"));
}